

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O2

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,printable_vtable *rhs)

{
  get_value_ptr_type p_Var1;
  void *pvVar2;
  printable_vtable local_38;
  
  local_38.vtable_._M_elems[2] = (rhs->vtable_)._M_elems[2];
  local_38.vtable_._M_elems[0] = (rhs->vtable_)._M_elems[0];
  local_38.vtable_._M_elems[1] = (rhs->vtable_)._M_elems[1];
  local_38.get_value_ptr_ = rhs->get_value_ptr_;
  local_38.value_ = rhs->value_;
  rhs->get_value_ptr_ = get_value_ptr<false>;
  std::array<void_(*)(),_3UL>::swap(&local_38.vtable_,&this->vtable_);
  p_Var1 = this->get_value_ptr_;
  pvVar2 = this->value_;
  this->get_value_ptr_ = local_38.get_value_ptr_;
  this->value_ = local_38.value_;
  local_38.get_value_ptr_ = p_Var1;
  local_38.value_ = pvVar2;
  ~printable_vtable(&local_38);
  return this;
}

Assistant:

printable_vtable & operator= (printable_vtable && rhs) noexcept
    {
        printable_vtable temp(std::move(rhs));
        std::swap(temp.vtable_, vtable_);
        std::swap(temp.get_value_ptr_, get_value_ptr_);
        std::swap(temp.value_, value_);
        return *this;
    }